

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.cpp
# Opt level: O2

IntersecRes * intersectionT(IntersecRes *__return_storage_ptr__,Segment *segment,Triangle *triangle)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dc_02;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined4 extraout_XMM0_Dd_01;
  undefined4 extraout_XMM0_Dd_02;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  float fVar6;
  Point PVar7;
  Vector VVar8;
  Vector local_c8;
  Vector local_b8;
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  Vector local_78;
  Vector local_68;
  float local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined1 local_48 [16];
  float local_38;
  float local_34;
  
  PVar7 = operator-(segment->b,&segment->a);
  local_78.z = PVar7.z;
  local_78._0_8_ = PVar7._0_8_;
  VVar8 = normalize(&local_78);
  local_c8.z = VVar8.z;
  local_c8._0_8_ = VVar8._0_8_;
  local_a8._8_4_ = extraout_XMM0_Dc;
  local_a8._0_4_ = local_c8.x;
  local_a8._4_4_ = local_c8.y;
  local_a8._12_4_ = extraout_XMM0_Dd;
  uVar3 = 0;
  uVar4 = 0;
  uVar5 = 0;
  local_38 = local_c8.z;
  PVar7 = operator-(triangle->y,&triangle->x);
  local_78.z = PVar7.z;
  local_78._0_8_ = PVar7._0_8_;
  local_48._8_4_ = extraout_XMM0_Dc_00;
  local_48._0_4_ = local_78.x;
  local_48._4_4_ = local_78.y;
  local_48._12_4_ = extraout_XMM0_Dd_00;
  local_58 = local_78.z;
  uStack_54 = uVar3;
  uStack_50 = uVar4;
  uStack_4c = uVar5;
  PVar7 = operator-(triangle->z,&triangle->x);
  local_b8.z = PVar7.z;
  local_b8._0_8_ = PVar7._0_8_;
  local_98._8_4_ = extraout_XMM0_Dc_01;
  local_98._0_4_ = local_b8.x;
  local_98._4_4_ = local_b8.y;
  local_98._12_4_ = extraout_XMM0_Dd_01;
  local_34 = local_b8.z;
  VVar8 = crossProduct(&local_c8,&local_b8);
  local_58 = local_58 * VVar8.z + (float)local_48._0_4_ * VVar8.x + (float)local_48._4_4_ * VVar8.y;
  if (1.1920929e-07 <= ABS(local_58)) {
    local_58 = 1.0 / local_58;
    local_88._8_4_ = extraout_XMM0_Dc_02;
    local_88._0_8_ = VVar8._0_8_;
    local_88._12_4_ = extraout_XMM0_Dd_02;
    local_48._0_4_ = VVar8.z;
    PVar7 = operator-(segment->a,&triangle->x);
    local_68.z = PVar7.z;
    local_68._0_8_ = PVar7._0_8_;
    local_48._0_4_ =
         ((float)local_48._0_4_ * local_68.z +
         (float)local_88._0_4_ * PVar7.x + (float)local_88._4_4_ * PVar7.y) * local_58;
    if ((0.0 <= (float)local_48._0_4_) && ((float)local_48._0_4_ <= 1.0)) {
      VVar8 = crossProduct(&local_68,&local_78);
      fVar6 = (local_38 * VVar8.z +
              (float)local_a8._0_4_ * VVar8.x + (float)local_a8._4_4_ * VVar8.y) * local_58;
      if ((0.0 <= fVar6) && ((float)local_48._0_4_ + fVar6 <= 1.0)) {
        local_58 = local_58 *
                   (local_34 * VVar8.z +
                   VVar8.x * (float)local_98._0_4_ + VVar8.y * (float)local_98._4_4_);
        if (0.0 < local_58) {
          uVar1 = (segment->a).x;
          uVar2 = (segment->a).y;
          fVar6 = (segment->a).z;
          __return_storage_ptr__->exists = true;
          (__return_storage_ptr__->point).x = local_58 * (float)local_a8._0_4_ + (float)uVar1;
          (__return_storage_ptr__->point).y = (float)uVar2 + (float)local_a8._4_4_ * local_58;
          (__return_storage_ptr__->point).z = local_38 * local_58 + fVar6;
          __return_storage_ptr__->t = local_58;
          return __return_storage_ptr__;
        }
      }
    }
  }
  __return_storage_ptr__->exists = false;
  *(undefined3 *)&__return_storage_ptr__->field_0x1 = 0;
  (__return_storage_ptr__->point).x = 0.0;
  (__return_storage_ptr__->point).y = 0.0;
  (__return_storage_ptr__->point).z = 0.0;
  __return_storage_ptr__->t = 0.0;
  return __return_storage_ptr__;
}

Assistant:

IntersecRes intersectionT(Segment const& segment, Triangle const& triangle)
{
  Vector const D = normalize(segment.b - segment.a);

  Vector e1 = triangle.y - triangle.x;
  Vector e2 = triangle.z - triangle.x;

  Vector P = crossProduct(D, e2);
  float det = dotProduct(e1, P);

  if (isCloseToZero(det))
    return {false, {}};

  float inv_det = 1.f / det;
  Vector T = segment.a - triangle.x;
  float u = dotProduct(T, P) * inv_det;
  if (u < 0.f || u > 1.f)
    return {false, {}};

  Vector Q = crossProduct(T, e1);
  float v = dotProduct(D, Q) * inv_det;

  if (v < 0.f || u + v > 1.f)
    return {false, {}};

  float t = dotProduct(e2, Q) * inv_det;
  if (t > 0)
  {
    Point res = segment.a + D * t;
    return {true, res, t};
  }

  return {false, {}};
}